

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O2

void printBar(int np,string *pstr)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  
  std::operator<<((ostream *)&std::cout,"|");
  iVar2 = 0;
  if (0 < np) {
    iVar2 = np;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    std::operator<<((ostream *)&std::cout,(string *)pstr);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"|");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"|");
  return;
}

Assistant:

void printBar(int np, const std::string pstr)
{
	std::cout << "|";
	for (int i = 0; i < np; i++)
		std::cout << pstr;
	std::cout << "|" << std::endl;
	std::cout << "|";
}